

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node>::push_back
          (vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node> *this,
          tsvq_node *obj)

{
  ulong in_RSI;
  tsvq_node *in_RDI;
  bool bVar1;
  undefined2 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffda;
  undefined1 in_stack_ffffffffffffffdb;
  uint32_t in_stack_ffffffffffffffdc;
  
  bVar1 = true;
  if ((*(long *)in_RDI != 0) && (bVar1 = true, *(ulong *)in_RDI <= in_RSI)) {
    bVar1 = *(long *)in_RDI + (ulong)(uint)in_RDI->m_weight * 0x48 <= in_RSI;
  }
  if (!bVar1) {
    __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x267,
                  "void basisu::vector<basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node>::push_back(const T &) [T = basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node]"
                 );
  }
  if (*(uint32_t *)((long)&in_RDI->m_weight + 4) <= (uint)in_RDI->m_weight) {
    increase_capacity((vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node> *)
                      in_RDI,in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb,
                      (bool)in_stack_ffffffffffffffda);
  }
  scalar_type<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node>::construct
            (in_RDI,(tsvq_node *)
                    CONCAT44(in_stack_ffffffffffffffdc,
                             CONCAT13(in_stack_ffffffffffffffdb,
                                      CONCAT12(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8))
                            ));
  *(int *)&in_RDI->m_weight = (int)in_RDI->m_weight + 1;
  return;
}

Assistant:

BASISU_FORCE_INLINE void push_back(const T& obj)
      {
         assert(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
            increase_capacity(m_size + 1, true);

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;
      }